

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btMultibodyLink>::copy
          (btAlignedObjectArray<btMultibodyLink> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btMultibodyLink *pbVar3;
  undefined8 uVar4;
  void *in_RAX;
  long in_RCX;
  long lVar5;
  long lVar6;
  
  lVar6 = (long)(int)dst;
  lVar5 = lVar6 * 600 + 0x248;
  for (; lVar6 < (int)src; lVar6 = lVar6 + 1) {
    pbVar3 = this->m_data;
    in_RAX = memcpy((void *)(in_RCX + lVar5 + -0x248),(void *)(lVar5 + -0x248 + (long)pbVar3),0x208)
    ;
    puVar1 = (undefined8 *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar5 + -0x44);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(in_RCX + -0x40 + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar5 + -0x34);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(in_RCX + -0x30 + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar5 + -0x24);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(in_RCX + -0x20 + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar5 + -0x14);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(in_RCX + -0x10 + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar5 + -4);
    uVar4 = puVar1[1];
    *(undefined8 *)(in_RCX + lVar5) = *puVar1;
    ((undefined8 *)(in_RCX + lVar5))[1] = uVar4;
    lVar5 = lVar5 + 600;
  }
  return (int)in_RAX;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}